

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O2

int anon_unknown.dwarf_7f0079::MapVersionToIndex(int version)

{
  int iVar1;
  
  iVar1 = 0;
  if ((version != 100) && (version != 500)) {
    if (version != 0x78) {
      if (version == 0x82) {
        iVar1 = 3;
      }
      else if (version == 0x8c) {
        iVar1 = 4;
      }
      else if (version == 0x96) {
        iVar1 = 5;
      }
      else if (version == 300) {
        iVar1 = 6;
      }
      else if (version == 0x136) {
        iVar1 = 0xd;
      }
      else if (version == 0x140) {
        iVar1 = 0xf;
      }
      else if (version == 0x14a) {
        iVar1 = 7;
      }
      else if (version == 400) {
        iVar1 = 8;
      }
      else if (version == 0x19a) {
        iVar1 = 9;
      }
      else if (version == 0x1a4) {
        iVar1 = 10;
      }
      else if (version == 0x1ae) {
        iVar1 = 0xb;
      }
      else if (version == 0x1b8) {
        iVar1 = 0xc;
      }
      else if (version == 0x1c2) {
        iVar1 = 0xe;
      }
      else if (version == 0x1cc) {
        iVar1 = 0x10;
      }
      else {
        if (version != 0x6e) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ShaderLang.cpp"
                        ,0xa0,"int (anonymous namespace)::MapVersionToIndex(int)");
        }
        iVar1 = 1;
      }
      return iVar1;
    }
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int MapVersionToIndex(int version)
{
    int index = 0;

    switch (version) {
    case 100: index =  0; break;
    case 110: index =  1; break;
    case 120: index =  2; break;
    case 130: index =  3; break;
    case 140: index =  4; break;
    case 150: index =  5; break;
    case 300: index =  6; break;
    case 330: index =  7; break;
    case 400: index =  8; break;
    case 410: index =  9; break;
    case 420: index = 10; break;
    case 430: index = 11; break;
    case 440: index = 12; break;
    case 310: index = 13; break;
    case 450: index = 14; break;
    case 500: index =  0; break; // HLSL
    case 320: index = 15; break;
    case 460: index = 16; break;
    default:  assert(0);  break;
    }

    assert(index < VersionCount);

    return index;
}